

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleMainWindow::childAt(QAccessibleMainWindow *this,int x,int y)

{
  QWidgetData *pQVar1;
  QObject *pQVar2;
  long lVar3;
  QWidget **ppQVar4;
  bool bVar5;
  char cVar6;
  QWidget *pQVar7;
  QAccessibleInterface *pQVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QPoint local_68;
  QPoint local_60;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  if ((pQVar7->data->widget_attributes & 0x8000) != 0) {
    local_58.d = (Data *)0x0;
    local_58.d = (Data *)QWidget::mapToGlobal(pQVar7,(QPoint *)&local_58);
    pQVar1 = pQVar7->data;
    local_58.ptr = (QWidget **)
                   CONCAT44(((pQVar1->crect).y2.m_i + SUB84(local_58.d,4)) - (pQVar1->crect).y1.m_i,
                            ((pQVar1->crect).x2.m_i + (int)local_58.d) - (pQVar1->crect).x1.m_i);
    bVar5 = QRect::contains((QRect *)&local_58,x,y);
    if (bVar5) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = &mainWindow(this)->super_QWidget;
      _q_ac_childWidgets((QWidgetList *)&local_58,pQVar7);
      pQVar7 = &mainWindow(this)->super_QWidget;
      local_68.xp.m_i = x;
      local_68.yp.m_i = y;
      local_60 = QWidget::mapFromGlobal(pQVar7,&local_68);
      ppQVar4 = local_58.ptr;
      lVar10 = local_58.size << 3;
      pQVar8 = (QAccessibleInterface *)0x0;
      for (lVar9 = 0; lVar10 != lVar9; lVar9 = lVar9 + 8) {
        pQVar2 = *(QObject **)((long)ppQVar4 + lVar9);
        lVar3 = *(long *)(pQVar2 + 0x20);
        if (((*(byte *)(lVar3 + 0xc) & 1) == 0) && ((*(byte *)(lVar3 + 10) & 1) == 0)) {
          cVar6 = QRect::contains((QPoint *)(lVar3 + 0x14),SUB81(&local_60,0));
          if (cVar6 != '\0') {
            pQVar8 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
            break;
          }
        }
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
      goto LAB_004d4bcb;
    }
  }
  pQVar8 = (QAccessibleInterface *)0x0;
LAB_004d4bcb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMainWindow::childAt(int x, int y) const
{
    QWidget *w = widget();
    if (!w->isVisible())
        return nullptr;
    QPoint gp = w->mapToGlobal(QPoint(0, 0));
    if (!QRect(gp.x(), gp.y(), w->width(), w->height()).contains(x, y))
        return nullptr;

    const QWidgetList kids = _q_ac_childWidgets(mainWindow());
    QPoint rp = mainWindow()->mapFromGlobal(QPoint(x, y));
    for (QWidget *child : kids) {
        if (!child->isWindow() && !child->isHidden() && child->geometry().contains(rp)) {
            return QAccessible::queryAccessibleInterface(child);
        }
    }
    return nullptr;
}